

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* load(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *__return_storage_ptr__,string *fname)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  byte bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_12b8;
  allocator local_1279;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1270;
  iterator local_1250;
  size_type local_1248;
  undefined1 local_1239;
  char local_1238 [8];
  char buf [4096];
  string local_228 [8];
  fstream f;
  string *fname_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *set;
  
  std::fstream::fstream(local_228);
  std::fstream::open(local_228,(_Ios_Openmode)fname);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    std::fstream::close();
    memset(__return_storage_ptr__,0,0x30);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(__return_storage_ptr__);
  }
  else {
    local_1239 = '\0';
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(__return_storage_ptr__);
    while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
      std::istream::getline((char *)local_228,(long)local_1238);
      local_1278 = &local_1270;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1270,local_1238,&local_1279);
      local_1250 = &local_1270;
      local_1248 = 1;
      __l._M_len = 1;
      __l._M_array = local_1250;
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(__return_storage_ptr__,__l);
      local_12b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1250;
      do {
        local_12b8 = local_12b8 + -1;
        std::__cxx11::string::~string((string *)local_12b8);
      } while (local_12b8 != &local_1270);
      std::allocator<char>::~allocator((allocator<char> *)&local_1279);
    }
    local_1239 = '\x01';
  }
  std::fstream::~fstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

std::set<std::string> load(const std::string &fname) {
    std::fstream f;
    f.open(fname, std::ios::in);
    char buf[4096];
    if (f.is_open()) {
        std::set<std::string> set;
        while (!f.eof()) {
            f.getline(buf, sizeof(buf) / sizeof(char));
            set.insert({buf});
        }
        return set;
    }
    f.close();
    return std::set<std::string>();
}